

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall Operand::Operand(Operand *this,Type t,string *v)

{
  string *v_local;
  Type t_local;
  Operand *this_local;
  
  this->type = t;
  this->reg_num = 0;
  std::__cxx11::string::string((string *)&this->value,(string *)v);
  if (this->type == literal) {
    return;
  }
  __assert_fail("type == Type::literal",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zany80[P]x86-to-z80/src/types.h"
                ,0x38,"Operand::Operand(const Type, std::string)");
}

Assistant:

Operand(const Type t, std::string v)
			: type(t)
			, value(std::move(v)) {
		assert(type == Type::literal);
	}